

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O2

void __thiscall Corrade::Utility::StringStream::sync(StringStream *this)

{
  undefined1 *array;
  size_t size;
  char *pcVar1;
  char *data_00;
  long lVar2;
  _func_void_char_ptr_size_t *deleter;
  char *data;
  anon_union_24_2_2c69c8ed_for_String_0 local_28;
  
  if (*(long *)&(this->super_ostream).field_0x48 != 0) {
    array = &(this->super_ostream).field_0x48;
    Containers::arrayResize<char,Corrade::Containers::ArrayMallocAllocator<char>>
              (array,(*(long *)&(this->super_ostream).field_0x30 +
                     *(long *)&(this->super_ostream).field_0x68) -
                     *(long *)&(this->super_ostream).field_0x28);
    local_28._small.data[0] = '\0';
    Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
              ((Array<char,_void_(*)(char_*,_unsigned_long)> *)array,(type_conflict2 *)&local_28);
    data_00 = *(char **)&(this->super_ostream).field_0x48;
    lVar2 = *(long *)&(this->super_ostream).field_0x50;
    size = lVar2 - 1;
    *(size_t *)&(this->super_ostream).field_0x68 = size;
    pcVar1 = data_00 + lVar2 + -1;
    *(char **)&(this->super_ostream).field_0x30 = pcVar1;
    *(char **)&(this->super_ostream).field_0x28 = pcVar1;
    *(char **)&(this->super_ostream).field_0x38 = pcVar1;
    deleter = *(_func_void_char_ptr_size_t **)&(this->super_ostream).field_0x58;
    *(undefined8 *)array = 0;
    *(undefined8 *)&(this->super_ostream).field_0x50 = 0;
    *(undefined8 *)&(this->super_ostream).field_0x58 = 0;
    Containers::String::String((String *)&local_28._small,data_00,size,deleter);
    Containers::String::operator=
              (*(String **)&(this->super_ostream).field_0x60,(String *)&local_28._small);
    Containers::String::~String((String *)&local_28._small);
  }
  return;
}

Assistant:

int sync() override {
            /* If sync() gets called multiple times without any overflow() in
               between, the data are owned by the string, not the array, and
               the remaining capacity is artificially set to 0 in a setp() call
               to prevent it from being appended to. Exit early in that case as
               there's nothing left to be done. */
            if(!_data)
                return 0;

            /* Resize to just what had been written, add a null terminator at
               the end */
            /** @todo clean up once the string is capable of growing */
            arrayResize(_data, NoInit, _initialSize + pptr() - pbase());
            arrayAppend(_data, '\0');

            /* The above might have reallocated, for example when the _data had
               no space for the null terminator. Call setp() to update the
               pointers, but don't leave any extra capacity to force overflow()
               to be called for next append, which then adopts the string back
               to the array. Otherwise it would be impossible to distinguish
               whether the string was modified by the stream (causing pptr() to
               change) or from outside (causing pptr() to point to an outdated
               location). */
            _initialSize = _data.size() - 1;
            setp(_data.end() - 1, _data.end() - 1);

            /* Move the array guts back to the string, making it one byte
               smaller as the last byte is the null terminator */
            const Containers::Array<char>::Deleter deleter = _data.deleter();
            _out = Containers::String{_data.release(), _initialSize, deleter};

            return 0;
        }